

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O2

QPainter * __thiscall QWidgetPrivate::sharedPainter(QWidgetPrivate *this)

{
  long lVar1;
  QWidget *pQVar2;
  QPainter *pQVar3;
  
  pQVar2 = QWidget::window(*(QWidget **)&this->field_0x8);
  lVar1 = *(long *)(*(long *)&pQVar2->field_0x8 + 0x78);
  if ((lVar1 == 0) || (lVar1 = *(long *)(lVar1 + 8), lVar1 == 0)) {
    pQVar3 = (QPainter *)0x0;
  }
  else {
    pQVar3 = *(QPainter **)(lVar1 + 0x18);
  }
  return pQVar3;
}

Assistant:

inline QPainter *QWidgetPrivate::sharedPainter() const
{
    Q_Q(const QWidget);
    QTLWExtra *x = q->window()->d_func()->maybeTopData();
    return x ? x->sharedPainter : nullptr;
}